

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_vm_dump(unqlite_vm *pVm,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData)

{
  char *pcVar1;
  SySet *pSVar2;
  sxi32 sVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uVar8;
  
  iVar4 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    uVar8 = 0xffffffe8;
    pSVar2 = pVm->pJx9Vm->pByteContainer;
    pcVar7 = (char *)pSVar2->pBase;
    uVar6 = (ulong)pSVar2->nUsed;
    (*xConsumer)("====================================================\nJX9 VM Dump   Copyright (C) 2012-2013 Symisc Systems\n                              http://jx9.symisc.net/\n====================================================\n"
                 ,0xd4,pUserData);
    if (uVar6 != 0) {
      pcVar1 = pcVar7 + uVar6 * 0x18;
      uVar6 = 0;
      do {
        pcVar5 = "Unknown     ";
        if ((byte)(*pcVar7 - 1U) < 0x45) {
          pcVar5 = &DAT_001431f8 + *(int *)(&DAT_001431f8 + (ulong)(byte)(*pcVar7 - 1U) * 4);
        }
        sVar3 = SyProcFormat(xConsumer,pUserData,(char *)(ulong)*(uint *)(pcVar7 + 0x10),pcVar5,
                             (ulong)*(uint *)(pcVar7 + 4),(ulong)*(uint *)(pcVar7 + 8),
                             (char *)(ulong)*(uint *)(pcVar7 + 0x10),uVar6,uVar8);
        if (sVar3 != 0) {
          return sVar3;
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        pcVar7 = pcVar7 + 0x18;
      } while (pcVar7 < pcVar1);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int unqlite_vm_dump(unqlite_vm *pVm, int (*xConsumer)(const void *, unsigned int, void *), void *pUserData)
{
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Dump the Jx9 VM */
	 rc = jx9VmDump(pVm->pJx9Vm,xConsumer,pUserData);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}